

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevolute::IntStateScatterReactions
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *L)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar41;
  double *pdVar42;
  ChBodyFrame *pCVar43;
  int iVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ChMatrix33<double> mat2;
  ChMatrix33<double> *local_70;
  ChMatrix33<double> *local_68;
  ChMatrix33<double> local_60;
  
  iVar44 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])()
  ;
  if ((char)iVar44 == '\0') {
    return;
  }
  lVar41 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar41) {
    pdVar42 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = pdVar42[off_L];
    this->m_multipliers[0] = pdVar42[off_L];
    if ((long)(ulong)(off_L + 1) < lVar41) {
      dVar52 = pdVar42[off_L + 1];
      this->m_multipliers[1] = dVar52;
      if ((long)(ulong)(off_L + 2) < lVar41) {
        auVar59._8_8_ = 0;
        auVar59._0_8_ = pdVar42[off_L + 2];
        this->m_multipliers[2] = pdVar42[off_L + 2];
        if ((long)(ulong)(off_L + 3) < lVar41) {
          dVar1 = pdVar42[off_L + 3];
          this->m_multipliers[3] = dVar1;
          if ((long)(ulong)(off_L + 4) < lVar41) {
            dVar2 = pdVar42[off_L + 4];
            this->m_multipliers[4] = dVar2;
            pCVar43 = (this->super_ChLink).Body2;
            local_70 = &(pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar66._8_8_ = 0;
            auVar66._0_8_ =
                 dVar52 * (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar17 = vfmadd231sd_fma(auVar66,auVar45,auVar17);
            auVar18._8_8_ = 0;
            auVar18._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar17 = vfmadd231sd_fma(auVar17,auVar59,auVar18);
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar69._8_8_ = 0;
            auVar69._0_8_ =
                 dVar52 * (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar18 = vfmadd231sd_fma(auVar69,auVar45,auVar19);
            auVar20._8_8_ = 0;
            auVar20._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar18 = vfmadd231sd_fma(auVar18,auVar59,auVar20);
            auVar21._8_8_ = 0;
            auVar21._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar53._8_8_ = 0;
            auVar53._0_8_ =
                 dVar52 * (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar45 = vfmadd231sd_fma(auVar53,auVar45,auVar21);
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar45 = vfmadd231sd_fma(auVar45,auVar59,auVar22);
            dVar52 = auVar45._0_8_;
            auVar23._8_8_ = 0;
            auVar23._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar46._8_8_ = 0;
            auVar46._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar45 = vfmadd231sd_fma(auVar46,auVar18,auVar23);
            auVar24._8_8_ = 0;
            auVar24._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar45 = vfmadd231sd_fma(auVar45,auVar17,auVar24);
            auVar25._8_8_ = 0;
            auVar25._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar60._8_8_ = 0;
            auVar60._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar59 = vfmadd231sd_fma(auVar60,auVar18,auVar25);
            auVar26._8_8_ = 0;
            auVar26._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar59 = vfmadd231sd_fma(auVar59,auVar17,auVar26);
            auVar27._8_8_ = 0;
            auVar27._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar54._8_8_ = 0;
            auVar54._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar18 = vfmadd231sd_fma(auVar54,auVar18,auVar27);
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar17 = vfmadd231sd_fma(auVar18,auVar17,auVar28);
            (this->super_ChLink).react_force.m_data[0] = auVar17._0_8_;
            (this->super_ChLink).react_force.m_data[1] = auVar59._0_8_;
            (this->super_ChLink).react_force.m_data[2] = auVar45._0_8_;
            pCVar43 = (this->super_ChLink).Body1;
            dVar52 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
            dVar3 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
            dVar4 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[6];
            dVar5 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0];
            dVar6 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
            dVar7 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[2];
            dVar8 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[3];
            dVar9 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
            dVar10 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
            dVar11 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
            dVar12 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
            dVar13 = (pCVar43->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
            dVar14 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
            dVar15 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4];
            dVar16 = (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
            local_68 = &this->m_w2_tilde;
            ChMatrix33<double>::
            ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
                      (&local_60,
                       (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                        *)&local_70);
            auVar61._8_8_ = 0;
            auVar61._0_8_ = dVar52;
            auVar70._8_8_ = 0;
            auVar70._0_8_ = dVar11;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = dVar3 * dVar12;
            auVar45 = vfmadd231sd_fma(auVar47,auVar70,auVar61);
            auVar74._8_8_ = 0;
            auVar74._0_8_ = dVar4;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = dVar13;
            auVar45 = vfmadd231sd_fma(auVar45,auVar75,auVar74);
            auVar77._8_8_ = 0;
            auVar77._0_8_ = dVar14;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = dVar15 * dVar12;
            auVar59 = vfmadd231sd_fma(auVar55,auVar77,auVar70);
            auVar78._8_8_ = 0;
            auVar78._0_8_ = dVar16;
            auVar59 = vfmadd231sd_fma(auVar59,auVar78,auVar75);
            dVar52 = dVar1 * auVar45._0_8_ + dVar2 * auVar59._0_8_;
            auVar79._8_8_ = 0;
            auVar79._0_8_ = dVar5;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = dVar6 * dVar3;
            auVar45 = vfmadd231sd_fma(auVar56,auVar79,auVar61);
            auVar80._8_8_ = 0;
            auVar80._0_8_ = dVar7;
            auVar45 = vfmadd231sd_fma(auVar45,auVar80,auVar74);
            auVar62._8_8_ = 0;
            auVar62._0_8_ = dVar6 * dVar15;
            auVar59 = vfmadd231sd_fma(auVar62,auVar77,auVar79);
            auVar59 = vfmadd231sd_fma(auVar59,auVar78,auVar80);
            dVar4 = dVar1 * auVar45._0_8_ + dVar2 * auVar59._0_8_;
            auVar76._8_8_ = 0;
            auVar76._0_8_ = dVar8;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = dVar9 * dVar3;
            auVar45 = vfmadd231sd_fma(auVar63,auVar76,auVar61);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = dVar10;
            auVar45 = vfmadd231sd_fma(auVar45,auVar72,auVar74);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = dVar9 * dVar15;
            auVar59 = vfmadd231sd_fma(auVar67,auVar76,auVar77);
            auVar59 = vfmadd231sd_fma(auVar59,auVar72,auVar78);
            dVar1 = dVar1 * auVar45._0_8_ + dVar2 * auVar59._0_8_;
            auVar29._8_8_ = 0;
            auVar29._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar57._8_8_ = 0;
            auVar57._0_8_ = dVar4;
            auVar68._8_8_ = 0;
            auVar68._0_8_ =
                 dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[5];
            auVar45 = vfmadd231sd_fma(auVar68,auVar57,auVar29);
            auVar30._8_8_ = 0;
            auVar30._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar48._8_8_ = 0;
            auVar48._0_8_ = dVar52;
            auVar45 = vfmadd231sd_fma(auVar45,auVar48,auVar30);
            auVar31._8_8_ = 0;
            auVar31._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar71._8_8_ = 0;
            auVar71._0_8_ =
                 dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[3];
            auVar59 = vfmadd231sd_fma(auVar71,auVar57,auVar31);
            auVar32._8_8_ = 0;
            auVar32._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar59 = vfmadd231sd_fma(auVar59,auVar48,auVar32);
            auVar33._8_8_ = 0;
            auVar33._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar58._8_8_ = 0;
            auVar58._0_8_ = dVar4;
            auVar64._8_8_ = 0;
            auVar64._0_8_ =
                 dVar1 * local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array[4];
            auVar17 = vfmadd231sd_fma(auVar64,auVar58,auVar33);
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 local_60.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar49._8_8_ = 0;
            auVar49._0_8_ = dVar52;
            auVar17 = vfmadd231sd_fma(auVar17,auVar49,auVar34);
            dVar52 = auVar17._0_8_;
            auVar35._8_8_ = 0;
            auVar35._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar50._8_8_ = 0;
            auVar50._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[5];
            auVar17 = vfmadd231sd_fma(auVar50,auVar59,auVar35);
            auVar36._8_8_ = 0;
            auVar36._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
            auVar17 = vfmadd231sd_fma(auVar17,auVar45,auVar36);
            auVar51._0_8_ = auVar17._0_8_ ^ 0x8000000000000000;
            auVar51._8_8_ = auVar17._8_8_ ^ 0x8000000000000000;
            auVar37._8_8_ = 0;
            auVar37._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
            auVar73._8_8_ = 0;
            auVar73._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
            auVar17 = vfmadd231sd_fma(auVar73,auVar59,auVar37);
            auVar38._8_8_ = 0;
            auVar38._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
            auVar17 = vfmadd231sd_fma(auVar17,auVar45,auVar38);
            auVar39._8_8_ = 0;
            auVar39._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar65._8_8_ = 0;
            auVar65._0_8_ =
                 dVar52 * (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[3];
            auVar59 = vfmadd231sd_fma(auVar65,auVar59,auVar39);
            auVar40._8_8_ = 0;
            auVar40._0_8_ =
                 (this->m_frame2).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
            auVar45 = vfmadd231sd_fma(auVar59,auVar45,auVar40);
            auVar45 = vunpcklpd_avx(auVar45,auVar17);
            (this->super_ChLink).react_torque.m_data[0] = -auVar45._0_8_;
            (this->super_ChLink).react_torque.m_data[1] = -auVar45._8_8_;
            dVar52 = (double)vmovlpd_avx(auVar51);
            (this->super_ChLink).react_torque.m_data[2] = dVar52;
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkRevolute::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);
    m_multipliers[4] = L(off_L + 4);

    // Also compute 'intuitive' reactions:
    ChVector<> lam_sph(m_multipliers[0], m_multipliers[1], m_multipliers[2]);
    double lam_uw = m_multipliers[3];
    double lam_vw = m_multipliers[4];

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the revolute joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(w2') *A_2^T * (u1 * lam_uw + v1 * lam_vw)
    //     = -C^T * [A_2 * tilde(w2')]^T * (u1 * lam_uw + v1 * lam_vw)

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChVector<> v1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Yaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_w2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_uw * u1 + lam_vw * v1);
    react_torque = -(m_frame2.GetA().transpose() * T2);
}